

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::InsertSyntheticTestCase(string *name,CodeLocation *location)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  char *pcVar4;
  pointer pcVar5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  long *plVar8;
  TestFactoryBase *factory;
  long *plVar9;
  string message;
  string full_name;
  allocator local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  TestFactoryBase *local_130;
  undefined8 local_128;
  TestFactoryBase local_120;
  _func_int **pp_Stack_118;
  int local_110;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e8;
  _func_int **local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  TestFactoryBase *local_c8;
  _func_int **local_c0;
  TestFactoryBase local_b8;
  _func_int **pp_Stack_b0;
  int local_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  CodeLocation local_58;
  
  std::operator+(&local_150,"Paramaterized test suite ",name);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_150);
  local_108 = &local_f8;
  plVar9 = plVar8 + 2;
  if ((long *)*plVar8 == plVar9) {
    local_f8 = *plVar9;
    lStack_f0 = plVar8[3];
  }
  else {
    local_f8 = *plVar9;
    local_108 = (long *)*plVar8;
  }
  local_100 = plVar8[1];
  *plVar8 = (long)plVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  paVar1 = &local_150.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  std::operator+(&local_150,"UninstantiatedParamaterizedTestSuite<",name);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_150);
  local_a0 = &local_90;
  plVar9 = plVar8 + 2;
  if ((long *)*plVar8 == plVar9) {
    local_90 = *plVar9;
    lStack_88 = plVar8[3];
  }
  else {
    local_90 = *plVar9;
    local_a0 = (long *)*plVar8;
  }
  local_98 = plVar8[1];
  *plVar8 = (long)plVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_80 = local_a0;
  pcVar4 = (location->file)._M_dataplus._M_p;
  iVar3 = location->line;
  local_e8 = &local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_108,local_100 + (long)local_108);
  pcVar5 = (location->file)._M_dataplus._M_p;
  local_c8 = &local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar5,pcVar5 + (location->file)._M_string_length);
  local_a8 = location->line;
  std::__cxx11::string::string((string *)&local_78,pcVar4,&local_151);
  paVar2 = &local_58.file.field_2;
  local_58.file._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_58,local_78,local_78 + local_70);
  local_58.line = iVar3;
  factory = (TestFactoryBase *)operator_new(0x50);
  pp_Var7 = local_c0;
  pp_Var6 = local_e0;
  if (local_e8 == &local_d8) {
    local_150.field_2._8_8_ = local_d8._8_8_;
    local_150._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_150._M_dataplus._M_p = (pointer)local_e8;
  }
  local_150.field_2._M_allocated_capacity._1_7_ = local_d8._M_allocated_capacity._1_7_;
  local_150.field_2._M_local_buf[0] = local_d8._M_local_buf[0];
  local_e0 = (_func_int **)0x0;
  local_d8._M_local_buf[0] = '\0';
  if (local_c8 == &local_b8) {
    pp_Stack_118 = pp_Stack_b0;
    local_130 = &local_120;
  }
  else {
    local_130 = local_c8;
  }
  local_120._vptr_TestFactoryBase._1_7_ = local_b8._vptr_TestFactoryBase._1_7_;
  local_120._vptr_TestFactoryBase._0_1_ = local_b8._vptr_TestFactoryBase._0_1_;
  local_c0 = (_func_int **)0x0;
  local_b8._vptr_TestFactoryBase._0_1_ = 0;
  local_110 = local_a8;
  factory->_vptr_TestFactoryBase =
       (_func_int **)
       (
       _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal23InsertSyntheticTestCaseERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEENS2_12CodeLocationEE3__0EEPNS_8TestInfoEPKcSG_SG_SG_SG_iT0_E11FactoryImpl
       + 0x10);
  factory[1]._vptr_TestFactoryBase = (_func_int **)(factory + 3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p == paVar1) {
    factory[3]._vptr_TestFactoryBase = (_func_int **)local_150.field_2._M_allocated_capacity;
    factory[4]._vptr_TestFactoryBase = (_func_int **)local_150.field_2._8_8_;
  }
  else {
    factory[1]._vptr_TestFactoryBase = (_func_int **)local_150._M_dataplus._M_p;
    factory[3]._vptr_TestFactoryBase = (_func_int **)local_150.field_2._M_allocated_capacity;
  }
  factory[2]._vptr_TestFactoryBase = pp_Var6;
  local_150._M_string_length = 0;
  local_150.field_2._M_allocated_capacity = (ulong)(uint7)local_d8._M_allocated_capacity._1_7_ << 8;
  factory[5]._vptr_TestFactoryBase = (_func_int **)(factory + 7);
  if (local_130 == &local_120) {
    factory[7]._vptr_TestFactoryBase = local_120._vptr_TestFactoryBase;
    factory[8]._vptr_TestFactoryBase = pp_Stack_118;
  }
  else {
    factory[5]._vptr_TestFactoryBase = (_func_int **)local_130;
    factory[7]._vptr_TestFactoryBase = local_120._vptr_TestFactoryBase;
  }
  factory[6]._vptr_TestFactoryBase = pp_Var7;
  local_128 = 0;
  local_120._vptr_TestFactoryBase = (_func_int **)((ulong)local_b8._vptr_TestFactoryBase._1_7_ << 8)
  ;
  *(int *)&factory[9]._vptr_TestFactoryBase = local_a8;
  local_150._M_dataplus._M_p = (pointer)paVar1;
  local_130 = &local_120;
  local_e8 = &local_d8;
  local_c8 = &local_b8;
  MakeAndRegisterTestInfo
            ("GoogleTestVerification",(char *)local_80,(char *)0x0,(char *)0x0,&local_58,
             &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
             (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != paVar1) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_58.file._M_dataplus._M_p);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  return;
}

Assistant:

void InsertSyntheticTestCase(const std::string &name, CodeLocation location) {
  std::string message =
      "Paramaterized test suite " + name +
      " is defined via TEST_P, but never instantiated. None of the test cases "
      "will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only "
      "ones provided expand to nothing."
      "\n\n"
      "Ideally, TEST_P definitions should only ever be included as part of "
      "binaries that intend to use them. (As opposed to, for example, being "
      "placed in a library that may be linked in to get other utilities.)";

  std::string full_name = "UninstantiatedParamaterizedTestSuite<" + name + ">";
  RegisterTest(  //
      "GoogleTestVerification", full_name.c_str(),
      nullptr,  // No type parameter.
      nullptr,  // No value parameter.
      location.file.c_str(), location.line, [message, location] {
        return new FailureTest(location, message,
                               kErrorOnUninstantiatedParameterizedTest);
      });
}